

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O1

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob)

{
  int _w;
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int _w_00;
  int _h;
  Mat local_68;
  int local_34;
  
  iVar5 = bottom_blob->dims;
  _w_00 = bottom_blob->w;
  _w = bottom_blob->h;
  _h = bottom_blob->c;
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        local_34 = _w_00;
        free(*(void **)((long)top_blob->data + -8));
        _w_00 = local_34;
      }
    }
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    iVar1 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar4 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar3;
    top_blob->c = iVar4;
    top_blob->cstep = bottom_blob->cstep;
  }
  iVar1 = this->squeeze_h;
  if ((_h == 1 && iVar5 == 3) && this->squeeze_c != 0) {
    _h = _w_00;
    if (_w == 1 && iVar1 != 0) {
LAB_00127bd2:
      Mat::reshape(&local_68,bottom_blob,_h);
    }
    else {
      Mat::reshape(&local_68,bottom_blob,_w_00,_w);
    }
  }
  else if (_w == 1 && (1 < iVar5 && iVar1 != 0)) {
    if (_w_00 == 1 && this->squeeze_w != 0) goto LAB_00127bd2;
    Mat::reshape(&local_68,bottom_blob,_w_00,_h);
  }
  else {
    if (_w_00 != 1 || (iVar5 < 1 || this->squeeze_w == 0)) goto LAB_00127c59;
    if (iVar1 != 0 && _w == 1) goto LAB_00127bd2;
    Mat::reshape(&local_68,bottom_blob,_w,_h);
  }
  if (&local_68 != top_blob) {
    if (local_68.refcount != (int *)0x0) {
      LOCK();
      *local_68.refcount = *local_68.refcount + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->data = local_68.data;
    top_blob->refcount = local_68.refcount;
    top_blob->elemsize = local_68.elemsize;
    top_blob->dims = local_68.dims;
    top_blob->w = local_68.w;
    top_blob->h = local_68.h;
    top_blob->c = local_68.c;
    top_blob->cstep = local_68.cstep;
  }
  if (local_68.refcount != (int *)0x0) {
    LOCK();
    *local_68.refcount = *local_68.refcount + -1;
    UNLOCK();
    if ((*local_68.refcount == 0) && (local_68.data != (void *)0x0)) {
      free(*(void **)((long)local_68.data + -8));
    }
  }
LAB_00127c59:
  if (top_blob->data == (void *)0x0) {
    iVar5 = -100;
  }
  else {
    iVar5 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w);
        else
            top_blob = bottom_blob.reshape(w, h);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(w, channels);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(h, channels);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}